

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cc
# Opt level: O0

void sptk::world::anon_unknown_1::GetWindowedWaveform
               (double *x,int x_length,int fs,double current_f0,double current_position,
               int window_type,double window_length_ratio,double *waveform,RandnState *randn_state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  double *window_00;
  void *pvVar6;
  void *pvVar7;
  int in_EDX;
  long in_RDI;
  long in_R8;
  RandnState *in_R9;
  double in_XMM0_Qa;
  double dVar8;
  double in_XMM2_Qa;
  int i_2;
  double weighting_coefficient;
  int i_1;
  double tmp_weight2;
  double tmp_weight1;
  int i;
  double *window;
  int *safe_index;
  int *base_index;
  int half_window_length;
  int *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  double in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  double in_stack_ffffffffffffff88;
  double dVar9;
  undefined8 in_stack_ffffffffffffff90;
  double dVar10;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar11;
  
  iVar11 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  iVar4 = matlab_round(((in_XMM2_Qa * (double)in_EDX) / in_XMM0_Qa) / 2.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(iVar4 * 2 + 1);
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  window_00 = (double *)operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(iVar4 * 2 + 1);
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(iVar4 * 2 + 1);
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar5);
  SetParametersForGetWindowedWaveform
            ((int)((ulong)pvVar7 >> 0x20),(int)pvVar7,
             (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),iVar11,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
             (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,window_00);
  for (iVar11 = 0; iVar11 == iVar4 * 2 || SBORROW4(iVar11,iVar4 * 2) != iVar11 + iVar4 * -2 < 0;
      iVar11 = iVar11 + 1) {
    dVar10 = *(double *)(in_RDI + (long)*(int *)((long)pvVar6 + (long)iVar11 * 4) * 8);
    dVar9 = *(double *)((long)pvVar7 + (long)iVar11 * 8);
    dVar8 = randn(in_R9);
    *(double *)(in_R8 + (long)iVar11 * 8) = dVar10 * dVar9 + dVar8 * 1e-06;
  }
  dVar10 = 0.0;
  dVar9 = 0.0;
  for (iVar11 = 0; iVar11 == iVar4 * 2 || SBORROW4(iVar11,iVar4 * 2) != iVar11 + iVar4 * -2 < 0;
      iVar11 = iVar11 + 1) {
    dVar10 = *(double *)(in_R8 + (long)iVar11 * 8) + dVar10;
    dVar9 = *(double *)((long)pvVar7 + (long)iVar11 * 8) + dVar9;
  }
  for (iVar11 = 0; iVar11 == iVar4 * 2 || SBORROW4(iVar11,iVar4 * 2) != iVar11 + iVar4 * -2 < 0;
      iVar11 = iVar11 + 1) {
    *(double *)(in_R8 + (long)iVar11 * 8) =
         -*(double *)((long)pvVar7 + (long)iVar11 * 8) * (dVar10 / dVar9) +
         *(double *)(in_R8 + (long)iVar11 * 8);
  }
  if (window_00 != (double *)0x0) {
    operator_delete__(window_00);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  return;
}

Assistant:

static void GetWindowedWaveform(const double *x, int x_length, int fs,
    double current_f0, double current_position, int window_type,
    double window_length_ratio, double *waveform, RandnState *randn_state) {
  int half_window_length =
    matlab_round(window_length_ratio * fs / current_f0 / 2.0);

  int *base_index = new int[half_window_length * 2 + 1];
  int *safe_index = new int[half_window_length * 2 + 1];
  double *window  = new double[half_window_length * 2 + 1];

  SetParametersForGetWindowedWaveform(half_window_length, x_length,
      current_position, fs, current_f0, window_type, window_length_ratio,
      base_index, safe_index, window);

  // F0-adaptive windowing
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] =
      x[safe_index[i]] * window[i] + randn(randn_state) * world::kSafeGuardD4C;

  double tmp_weight1 = 0;
  double tmp_weight2 = 0;
  for (int i = 0; i <= half_window_length * 2; ++i) {
    tmp_weight1 += waveform[i];
    tmp_weight2 += window[i];
  }
  double weighting_coefficient = tmp_weight1 / tmp_weight2;
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] -= window[i] * weighting_coefficient;

  delete[] base_index;
  delete[] safe_index;
  delete[] window;
}